

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_submul_ui(__mpz_struct *r,__mpz_struct *u,unsigned_long v)

{
  __mpz_struct *in_RDX;
  __mpz_struct *in_RSI;
  mpz_t t;
  __mpz_struct *in_stack_00000028;
  __mpz_struct *in_stack_00000030;
  unsigned_long in_stack_ffffffffffffffd8;
  __mpz_struct *in_stack_ffffffffffffffe0;
  
  mpz_init_set_ui(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  mpz_mul(in_stack_00000030,in_stack_00000028,r);
  mpz_sub(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  mpz_clear((__mpz_struct *)0x9a84aa);
  return;
}

Assistant:

void
mpz_submul_ui (mpz_t r, const mpz_t u, unsigned long int v)
{
  mpz_t t;
  mpz_init_set_ui (t, v);
  mpz_mul (t, u, t);
  mpz_sub (r, r, t);
  mpz_clear (t);
}